

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O1

void __thiscall rotate_y::rotate_y(rotate_y *this,shared_ptr<hittable> *object,double angle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  double dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double y;
  double dVar20;
  double dVar21;
  point3 max;
  point3 min;
  vec3 tester;
  point3 local_98;
  point3 local_80;
  aabb local_68;
  double local_38;
  undefined8 uStack_30;
  
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR__rotate_y_00129ba0;
  (this->object).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var8 = (object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->object).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var8
  ;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
  }
  (this->bbox).x.min = INFINITY;
  (this->bbox).x.max = -INFINITY;
  (this->bbox).y.min = INFINITY;
  (this->bbox).y.max = -INFINITY;
  (this->bbox).z.min = INFINITY;
  (this->bbox).z.max = -INFINITY;
  dVar15 = (angle * 3.141592653589793) / 180.0;
  dVar16 = sin(dVar15);
  this->sin_theta = dVar16;
  dVar15 = cos(dVar15);
  this->cos_theta = dVar15;
  (*((object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_hittable[3])
            (&local_68);
  (this->bbox).z.min = local_68.z.min;
  (this->bbox).z.max = local_68.z.max;
  (this->bbox).y.min = local_68.y.min;
  (this->bbox).y.max = local_68.y.max;
  (this->bbox).x.min = local_68.x.min;
  (this->bbox).x.max = local_68.x.max;
  local_80.e[0] = INFINITY;
  local_80.e[1] = INFINITY;
  local_80.e[2] = INFINITY;
  local_98.e[0] = -INFINITY;
  local_98.e[1] = -INFINITY;
  local_98.e[2] = -INFINITY;
  dVar15 = (this->bbox).x.max;
  dVar16 = (this->bbox).x.min;
  dVar1 = (this->bbox).y.max;
  dVar2 = (this->bbox).y.min;
  dVar3 = (this->bbox).z.max;
  dVar4 = (this->bbox).z.min;
  dVar5 = this->sin_theta;
  dVar6 = this->cos_theta;
  local_38 = -dVar5;
  uStack_30 = 0x8000000000000000;
  dVar17 = 0.0;
  iVar10 = 0;
  do {
    dVar18 = dVar17 * dVar15 + (double)(1 - iVar10) * dVar16;
    dVar19 = 0.0;
    iVar11 = 0;
    do {
      dVar9 = 0.0;
      iVar12 = 0;
      do {
        dVar20 = dVar9 * dVar3 + (double)(1 - iVar12) * dVar4;
        local_68.x.min = dVar5 * dVar20 + dVar6 * dVar18;
        local_68.x.max = dVar19 * dVar1 + (double)(1 - iVar11) * dVar2;
        local_68.y.min = dVar20 * dVar6 + dVar18 * local_38;
        lVar13 = 0;
        do {
          dVar20 = local_80.e[lVar13];
          dVar7 = (&local_68.x.min)[lVar13];
          dVar21 = dVar7;
          if (dVar20 <= dVar7) {
            dVar21 = dVar20;
          }
          local_80.e[lVar13] =
               (double)(~-(ulong)NAN(dVar20) & (ulong)dVar21 | -(ulong)NAN(dVar20) & (ulong)dVar7);
          dVar20 = local_98.e[lVar13];
          dVar21 = dVar7;
          if (dVar7 <= dVar20) {
            dVar21 = dVar20;
          }
          local_98.e[lVar13] =
               (double)(~-(ulong)NAN(dVar20) & (ulong)dVar21 | -(ulong)NAN(dVar20) & (ulong)dVar7);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        dVar9 = dVar9 + 1.0;
        bVar14 = iVar12 == 0;
        iVar12 = iVar12 + 1;
      } while (bVar14);
      dVar19 = dVar19 + 1.0;
      bVar14 = iVar11 == 0;
      iVar11 = iVar11 + 1;
    } while (bVar14);
    dVar17 = dVar17 + 1.0;
    bVar14 = iVar10 == 0;
    iVar10 = iVar10 + 1;
  } while (bVar14);
  aabb::aabb(&local_68,&local_80,&local_98);
  (this->bbox).z.min = local_68.z.min;
  (this->bbox).z.max = local_68.z.max;
  (this->bbox).y.min = local_68.y.min;
  (this->bbox).y.max = local_68.y.max;
  (this->bbox).x.min = local_68.x.min;
  (this->bbox).x.max = local_68.x.max;
  return;
}

Assistant:

rotate_y(shared_ptr<hittable> object, double angle) : object(object) {
        auto radians = degrees_to_radians(angle);
        sin_theta = std::sin(radians);
        cos_theta = std::cos(radians);
        bbox = object->bounding_box();

        point3 min( infinity,  infinity,  infinity);
        point3 max(-infinity, -infinity, -infinity);

        for (int i = 0; i < 2; i++) {
            for (int j = 0; j < 2; j++) {
                for (int k = 0; k < 2; k++) {
                    auto x = i*bbox.x.max + (1-i)*bbox.x.min;
                    auto y = j*bbox.y.max + (1-j)*bbox.y.min;
                    auto z = k*bbox.z.max + (1-k)*bbox.z.min;

                    auto newx =  cos_theta*x + sin_theta*z;
                    auto newz = -sin_theta*x + cos_theta*z;

                    vec3 tester(newx, y, newz);

                    for (int c = 0; c < 3; c++) {
                        min[c] = std::fmin(min[c], tester[c]);
                        max[c] = std::fmax(max[c], tester[c]);
                    }
                }
            }
        }

        bbox = aabb(min, max);
    }